

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::TagOptionParser::parseIntoConfig
          (TagOptionParser *this,Command *cmd,ConfigData *config)

{
  ulong uVar1;
  string groupName;
  TestCaseFilters filters;
  string local_d8;
  TestCaseFilters local_b8;
  string local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    Command::operator[][abi_cxx11_((string *)&local_b8,cmd,uVar1);
    std::__cxx11::string::append((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  TestCaseFilters::TestCaseFilters(&local_b8,&local_d8);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    Command::operator[][abi_cxx11_(&local_50,cmd,uVar1);
    TestCaseFilters::addTags(&local_b8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
            (&config->filters,&local_b8);
  TestCaseFilters::~TestCaseFilters(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                std::string groupName;
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += cmd[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < cmd.argsCount(); ++i )
                    filters.addTags( cmd[i] );
                config.filters.push_back( filters );
            }